

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O3

IBot<uttt::IBoard> * __thiscall
generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::Clone
          (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *this)

{
  int iVar1;
  IBoard *pIVar2;
  undefined8 uVar3;
  short sVar4;
  short sVar5;
  IBot<uttt::IBoard> *pIVar6;
  IBoard *pIVar7;
  
  pIVar6 = (IBot<uttt::IBoard> *)operator_new(0x18);
  pIVar2 = (this->super_IBot<uttt::IBoard>).game;
  iVar1 = this->depth;
  pIVar6->_vptr_IBot = (_func_int **)&PTR__IBot_00161830;
  if (pIVar2 != (IBoard *)0x0) {
    pIVar7 = (IBoard *)operator_new(0x18);
    *(undefined8 *)((pIVar7->micro)._M_elems + 6) = *(undefined8 *)((pIVar2->micro)._M_elems + 6);
    sVar4 = (pIVar2->micro)._M_elems[0];
    sVar5 = (pIVar2->micro)._M_elems[1];
    uVar3 = *(undefined8 *)((pIVar2->micro)._M_elems + 2);
    pIVar7->macro = pIVar2->macro;
    (pIVar7->micro)._M_elems[0] = sVar4;
    (pIVar7->micro)._M_elems[1] = sVar5;
    *(undefined8 *)((pIVar7->micro)._M_elems + 2) = uVar3;
    pIVar6->game = pIVar7;
  }
  pIVar6->_vptr_IBot = (_func_int **)&PTR__IBot_00161a38;
  *(int *)&pIVar6[1]._vptr_IBot = iVar1;
  return pIVar6;
}

Assistant:

game::IBot<IGame> *Clone() const
    {
        return new MinimaxBot(this->game, depth);
    }